

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test-internal.h
# Opt level: O0

void __thiscall
testing::internal::InternalRunDeathTestFlag::~InternalRunDeathTestFlag
          (InternalRunDeathTestFlag *this)

{
  long lVar1;
  long in_FS_OFFSET;
  InternalRunDeathTestFlag *this_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < this->write_fd_) {
    posix::Close(this->write_fd_);
  }
  std::__cxx11::string::~string((string *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~InternalRunDeathTestFlag() {
    if (write_fd_ >= 0)
      posix::Close(write_fd_);
  }